

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O1

string * __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::getSpecializedVSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderInvalidArrayedInputVariablesTest *this)

{
  string vs_code;
  char *vs_code_raw;
  long *local_48 [2];
  long local_38 [2];
  long *local_28;
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,
             "${VERSION}\n\nout vec4 data;\n\nvoid main()\n{\n    data = vec4(gl_VertexID, 0, 0, 1);\n}\n"
             ,"");
  local_28 = local_48[0];
  TestCaseBase::specializeShader_abi_cxx11_
            (__return_storage_ptr__,&this->super_TestCaseBase,1,(char **)&local_28);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderInvalidArrayedInputVariablesTest::getSpecializedVSCode() const
{
	std::string vs_code = "${VERSION}\n"
						  "\n"
						  "out vec4 data;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    data = vec4(gl_VertexID, 0, 0, 1);\n"
						  "}\n";
	const char* vs_code_raw			= vs_code.c_str();
	std::string specialized_vs_code = specializeShader(1, /* parts */
													   &vs_code_raw);

	return specialized_vs_code;
}